

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

int yaml_parser_unroll_indent(yaml_parser_t *parser,ptrdiff_t column)

{
  yaml_token_t *__dest;
  int *piVar1;
  int iVar2;
  undefined4 local_70 [2];
  yaml_token_t token;
  ptrdiff_t column_local;
  yaml_parser_t *parser_local;
  
  token.end_mark.column = column;
  if (parser->flow_level == 0) {
    while ((long)token.end_mark.column < (long)parser->indent) {
      memset(local_70,0,0x50);
      local_70[0] = 9;
      token.data._16_8_ = (parser->mark).index;
      token.start_mark.index = (parser->mark).line;
      token.start_mark.line = (parser->mark).column;
      token.start_mark.column = (parser->mark).index;
      token.end_mark.index = (parser->mark).line;
      token.end_mark.line = (parser->mark).column;
      if (((parser->tokens).tail == (parser->tokens).end) &&
         (iVar2 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,
                                    &(parser->tokens).tail,&(parser->tokens).end), iVar2 == 0)) {
        parser->error = YAML_MEMORY_ERROR;
        return 0;
      }
      __dest = (parser->tokens).tail;
      (parser->tokens).tail = __dest + 1;
      memcpy(__dest,local_70,0x50);
      piVar1 = (parser->indents).top;
      (parser->indents).top = piVar1 + -1;
      parser->indent = piVar1[-1];
    }
  }
  return 1;
}

Assistant:

static int
yaml_parser_unroll_indent(yaml_parser_t *parser, ptrdiff_t column)
{
    yaml_token_t token;

    /* In the flow context, do nothing. */

    if (parser->flow_level)
        return 1;

    /* Loop through the indentation levels in the stack. */

    while (parser->indent > column)
    {
        /* Create a token and append it to the queue. */

        TOKEN_INIT(token, YAML_BLOCK_END_TOKEN, parser->mark, parser->mark);

        if (!ENQUEUE(parser, parser->tokens, token))
            return 0;

        /* Pop the indentation level. */

        parser->indent = POP(parser, parser->indents);
    }

    return 1;
}